

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

void pg::set_in_CALL(WorkerP *w,Task *__dq_head,int arg_1,int arg_2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int arg_2_local;
  int arg_1_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  int s;
  int n;
  int i;
  
  if (arg_2 < 0x41) {
    for (s = 0; s < arg_2; s = s + 1) {
      iVar3 = arg_1 + s;
      if (((*(int *)(done + (long)iVar3 * 4) != 3) &&
          (iVar2 = *(int *)(str + (long)iVar3 * 4), iVar2 != -1)) &&
         (*(int *)(halt + (long)iVar2 * 4) == 0)) {
        LOCK();
        piVar1 = (int *)(first_in + (long)iVar2 * 4);
        iVar2 = *piVar1;
        *piVar1 = iVar3;
        UNLOCK();
        *(int *)(next_in + (long)iVar3 * 4) = iVar2;
      }
    }
  }
  else {
    set_in_SPAWN(w,__dq_head,arg_1 + arg_2 / 2,arg_2 - arg_2 / 2);
    set_in_CALL(w,__dq_head + 1,arg_1,arg_2 / 2);
    set_in_SYNC(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_2(set_in, int, begin, int, count)
{
    // some cut-off point...
    if (count <= 64) {
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] != 3) {
                int s = str[n];
                if (s != -1 and !halt[s]) {
                    // atomically set first_in[s] to n, and return the previous value
                    next_in[n] = __sync_lock_test_and_set(first_in+s, n);
                }
            }
        }
    } else {
        SPAWN(set_in, begin+count/2, count-count/2);
        CALL(set_in, begin, count/2);
        SYNC(set_in);
    }
}